

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logistics_Header.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Logistics_Header::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Logistics_Header *this)

{
  ostream *poVar1;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KStringStream ss;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Receiving Entity ID:\t");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1e0,&this->m_ReceivingEntity);
  UTILS::IndentString(&local_1c0,&local_1e0,Tabs,in_CL);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tSupplying Entity ID:\t");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_220,&this->m_SupplyingEntity);
  UTILS::IndentString(&local_200,&local_220,Tabs_00,in_CL);
  std::operator<<(poVar1,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Logistics_Header::GetAsString() const
{
    KStringStream ss;

    ss << "Receiving Entity ID:	"
       << IndentString( m_ReceivingEntity.GetAsString(), 1 )
       << "\tSupplying Entity ID:	"
       << IndentString( m_SupplyingEntity.GetAsString(), 1 ) ;

    return ss.str();
}